

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

void __thiscall DataStream::ignore(DataStream *this,size_t num_ignore)

{
  long lVar1;
  pointer pbVar2;
  pointer pbVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = ~this->m_read_pos;
  if (num_ignore <= uVar6) {
    uVar4 = this->m_read_pos + num_ignore;
    pbVar2 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar7 = (long)pbVar3 - (long)pbVar2;
    if (uVar4 <= uVar7) {
      if (uVar6 < num_ignore) {
LAB_001bfaf4:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        if (uVar4 == uVar7) {
          this->m_read_pos = 0;
          if (pbVar3 != pbVar2) {
            (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
            .super__Vector_impl_data._M_finish = pbVar2;
          }
        }
        else {
          if (uVar6 < num_ignore) goto LAB_001bfaf4;
          this->m_read_pos = uVar4;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
      }
      goto LAB_001bfb35;
    }
  }
  pcVar5 = (char *)__cxa_allocate_exception(0x20);
  std::iostream_category();
  std::ios_base::failure[abi:cxx11]::failure
            (pcVar5,(error_code *)"DataStream::ignore(): end of data");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_001bfb35:
  __stack_chk_fail();
}

Assistant:

void ignore(size_t num_ignore)
    {
        // Ignore from the beginning of the buffer
        auto next_read_pos{CheckedAdd(m_read_pos, num_ignore)};
        if (!next_read_pos.has_value() || next_read_pos.value() > vch.size()) {
            throw std::ios_base::failure("DataStream::ignore(): end of data");
        }
        if (next_read_pos.value() == vch.size()) {
            m_read_pos = 0;
            vch.clear();
            return;
        }
        m_read_pos = next_read_pos.value();
    }